

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

int SUNMemoryHelper_Destroy(SUNMemoryHelper helper)

{
  long *in_RDI;
  int local_4;
  
  if (*(long *)(in_RDI[1] + 0x28) == 0) {
    if (*in_RDI == 0) {
      free((void *)in_RDI[1]);
      free(in_RDI);
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = (**(code **)(in_RDI[1] + 0x28))(in_RDI);
  }
  return local_4;
}

Assistant:

int SUNMemoryHelper_Destroy(SUNMemoryHelper helper)
{
  if (helper->ops->destroy == NULL)
  {
    if (helper->content != NULL)
    {
      return(-1);
    }
    else
    {
      free(helper->ops);
      free(helper);
    }
  }
  else
  {
    return(helper->ops->destroy(helper));
  }
  return(0);
}